

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O3

int __thiscall
CECoordinates::Galactic2Observed
          (CECoordinates *this,double glon,double glat,double *az,double *zen,double julian_date,
          double longitude,double latitude,double elevation_m,double pressure_hPa,
          double temperature_celsius,double relative_humidity,double dut1,double xp,double yp,
          double wavelength,double *observed_glon,double *observed_glat,double *hour_angle)

{
  int iVar1;
  double temp_dec;
  double temp_ra;
  double dec;
  double ra;
  double temp_hour_angle;
  double temp_glat;
  double temp_glon;
  CEDate date;
  CEAngleType local_f4;
  double local_f0;
  double local_e8;
  double *local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  CEDate local_70;
  
  local_78 = 0.0;
  local_80 = 0.0;
  local_e8 = 0.0;
  local_f0 = 0.0;
  if (zen == (double *)0x0) {
    zen = &local_78;
  }
  local_88 = 0.0;
  if (observed_glon == (double *)0x0) {
    observed_glon = &local_80;
  }
  local_90 = 0.0;
  local_98 = 0.0;
  local_e0 = az;
  local_d8 = julian_date;
  local_d0 = longitude;
  local_c8 = latitude;
  local_c0 = elevation_m;
  local_b8 = pressure_hPa;
  local_b0 = temperature_celsius;
  local_a8 = glon;
  local_a0 = glat;
  CEDate::CEDate(&local_70,julian_date,JD);
  local_f4 = RADIANS;
  Galactic2CIRS(local_a8,local_a0,&local_90,&local_98,&local_70,&local_f4);
  iVar1 = CIRS2Observed(this,local_90,local_98,local_e0,&local_e8,local_d8,local_d0,local_c8,
                        local_c0,local_b8,local_b0,relative_humidity,dut1,xp,yp,wavelength,&local_f0
                        ,&local_88,hour_angle);
  local_f4 = RADIANS;
  CIRS2Galactic(local_e8,local_f0,zen,observed_glon,&local_70,&local_f4);
  CEDate::~CEDate(&local_70);
  return iVar1;
}

Assistant:

int CECoordinates::Galactic2Observed(double glon, double glat,
                                     double *az, double *zen,
                                     double julian_date,
                                     double longitude,
                                     double latitude,
                                     double elevation_m,
                                     double pressure_hPa,
                                     double temperature_celsius,
                                     double relative_humidity,
                                     double dut1,
                                     double xp, double yp,
                                     double wavelength,
                                     double *observed_glon,
                                     double *observed_glat,
                                     double *hour_angle)
{
    // Setup the observed RA, Dec and hour_angle variables
    double temp_glon(0.0);
    double temp_glat(0.0);
    double temp_ra(0.0);
    double temp_dec(0.0);
    double temp_hour_angle(0.0);

    // If values were passed, point these variables at the passed ones
    if (observed_glon == nullptr) observed_glon = &temp_glon;
    if (observed_glat == nullptr) observed_glat = &temp_glat;
    if (hour_angle    == nullptr) hour_angle    = &temp_hour_angle;
    
    // Convert GALACTIC to ICRS
    double ra(0.0);
    double dec(0.0);
    CEDate date(julian_date, CEDateType::JD) ;
    Galactic2CIRS(glon, glat, &ra, &dec, date) ;

    // Call the necessary sofa method
    int err_code = CIRS2Observed(ra, dec,
                                 az, zen,
                                 julian_date,
                                 longitude,
                                 latitude,
                                 elevation_m,
                                 pressure_hPa,
                                 temperature_celsius,
                                 relative_humidity,
                                 dut1, xp, yp,
                                 wavelength,
                                 &temp_ra,
                                 &temp_dec,
                                 &temp_hour_angle) ;

    // Convert the apparent RA,Dec to galactic longitude,latitude
    CIRS2Galactic(temp_ra, temp_dec, observed_glon, observed_glat, date) ;
    
    return err_code ;
}